

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int planrobarm(PlannerType plannerType,char *envCfgFilename,bool forwardSearch)

{
  byte bVar1;
  int iVar2;
  undefined8 uVar3;
  ostream *poVar4;
  size_type sVar5;
  FILE *__stream;
  vector<int,_std::allocator<int>_> *this;
  vector<int,_std::allocator<int>_> *pvVar6;
  reference pvVar7;
  byte in_DL;
  undefined4 in_EDI;
  uint i;
  FILE *fSol;
  char *sol;
  SBPLPlanner *planner;
  vector<int,_std::allocator<int>_> solution_stateIDs_V;
  EnvironmentROBARM environment_robarm;
  bool bforwardsearch;
  MDPConfig MDPCfg;
  double allocated_time_secs;
  int bRet;
  char *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  uint local_1e4;
  ARAPlanner *local_1d0;
  vector<int,_std::allocator<int>_> local_1c8;
  MDPConfig local_1a0 [46];
  byte local_29;
  undefined4 local_28;
  undefined4 local_24;
  undefined8 local_20;
  int local_18;
  byte local_11;
  undefined4 local_4;
  
  local_29 = in_DL & 1;
  local_18 = 0;
  local_20 = 0x4014000000000000;
  local_11 = local_29;
  local_4 = in_EDI;
  EnvironmentROBARM::EnvironmentROBARM
            ((EnvironmentROBARM *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
  bVar1 = EnvironmentROBARM::InitializeEnv((char *)local_1a0);
  if ((bVar1 & 1) == 0) {
    uVar3 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd68);
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  bVar1 = EnvironmentROBARM::InitializeMDPCfg(local_1a0);
  if ((bVar1 & 1) == 0) {
    uVar3 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd68);
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x112e1b);
  local_1d0 = (ARAPlanner *)0x0;
  switch(local_4) {
  case 0:
    printf("Initializing ADPlanner...\n");
    local_1d0 = (ARAPlanner *)operator_new(0x98);
    ADPlanner::ADPlanner
              ((ADPlanner *)local_1d0,(DiscreteSpaceInformation *)local_1a0,(bool)(local_29 & 1));
    break;
  case 1:
    printf("Initializing ARAPlanner...\n");
    local_1d0 = (ARAPlanner *)operator_new(0xa0);
    ARAPlanner::ARAPlanner(local_1d0,(DiscreteSpaceInformation *)local_1a0,(bool)(local_29 & 1));
    break;
  default:
    printf("Invalid planner type\n");
    break;
  case 3:
    printf("Initializing RSTARPlanner...\n");
    local_1d0 = (ARAPlanner *)operator_new(0x68);
    RSTARPlanner::RSTARPlanner
              ((RSTARPlanner *)local_1d0,(DiscreteSpaceInformation *)local_1a0,(bool)(local_29 & 1))
    ;
    break;
  case 5:
    printf("Initializing anaPlanner...\n");
    local_1d0 = (ARAPlanner *)operator_new(0x48);
    anaPlanner::anaPlanner
              ((anaPlanner *)local_1d0,(DiscreteSpaceInformation *)local_1a0,(bool)(local_29 & 1));
  }
  iVar2 = (**(code **)(*(long *)local_1d0 + 0x28))(local_1d0,local_28);
  if (iVar2 == 0) {
    uVar3 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd68);
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  iVar2 = (**(code **)(*(long *)local_1d0 + 0x20))(local_1d0,local_24);
  if (iVar2 == 0) {
    uVar3 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd68);
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  printf("start planning...\n");
  local_18 = (*(code *)**(undefined8 **)local_1d0)(local_20,local_1d0,&local_1c8);
  printf("done planning\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"size of solution=");
  sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_1c8);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  __stream = fopen("sol.txt","w");
  if (__stream == (FILE *)0x0) {
    uVar3 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd68);
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  local_1e4 = 0;
  while( true ) {
    this = (vector<int,_std::allocator<int>_> *)(ulong)local_1e4;
    pvVar6 = (vector<int,_std::allocator<int>_> *)
             std::vector<int,_std::allocator<int>_>::size(&local_1c8);
    if (pvVar6 <= this) break;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_1c8,(ulong)local_1e4);
    EnvironmentROBARM::PrintState((int)local_1a0,SUB41(*pvVar7,0),(_IO_FILE *)0x1);
    local_1e4 = local_1e4 + 1;
  }
  fclose(__stream);
  if (local_18 == 0) {
    printf("Solution does not exist\n");
  }
  else {
    printf("Solution is found\n");
  }
  fflush((FILE *)0x0);
  if (local_1d0 != (ARAPlanner *)0x0) {
    (**(code **)(*(long *)local_1d0 + 0xa0))();
  }
  iVar2 = local_18;
  std::vector<int,_std::allocator<int>_>::~vector(this);
  EnvironmentROBARM::~EnvironmentROBARM
            ((EnvironmentROBARM *)CONCAT44(iVar2,in_stack_fffffffffffffd70));
  return iVar2;
}

Assistant:

int planrobarm(PlannerType plannerType, char* envCfgFilename, bool forwardSearch)
{
    int bRet = 0;
    double allocated_time_secs = 5.0; //in seconds
    MDPConfig MDPCfg;
    bool bforwardsearch = forwardSearch;

    //Initialize Environment (should be called before initializing anything else)
    EnvironmentROBARM environment_robarm;
    if (!environment_robarm.InitializeEnv(envCfgFilename)) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }

    //Initialize MDP Info
    if (!environment_robarm.InitializeMDPCfg(&MDPCfg)) {
        throw SBPL_Exception("ERROR: InitializeMDPCfg failed");
    }

    //srand(1);

    //plan a path
    vector<int> solution_stateIDs_V;

    SBPLPlanner* planner = NULL;
    switch (plannerType) {
    case PLANNER_TYPE_ARASTAR:
        printf("Initializing ARAPlanner...\n");
        planner = new ARAPlanner(&environment_robarm, bforwardsearch);
        break;
    case PLANNER_TYPE_ADSTAR:
        printf("Initializing ADPlanner...\n");
        planner = new ADPlanner(&environment_robarm, bforwardsearch);
        break;
    case PLANNER_TYPE_RSTAR:
        printf("Initializing RSTARPlanner...\n");
        planner = new RSTARPlanner(&environment_robarm, bforwardsearch);
        break;
    case PLANNER_TYPE_ANASTAR:
        printf("Initializing anaPlanner...\n");
        planner = new anaPlanner(&environment_robarm, bforwardsearch);
        break;
    default:
        printf("Invalid planner type\n");
        break;
    }

    if (planner->set_start(MDPCfg.startstateid) == 0) {
        throw SBPL_Exception("ERROR: failed to set start state");
    }

    if (planner->set_goal(MDPCfg.goalstateid) == 0) {
        throw SBPL_Exception("ERROR: failed to set goal state");
    }

    printf("start planning...\n");
    bRet = planner->replan(allocated_time_secs, &solution_stateIDs_V);
    printf("done planning\n");
    std::cout << "size of solution=" << solution_stateIDs_V.size() << std::endl;

    const char* sol = "sol.txt";
    FILE* fSol = fopen(sol, "w");
    if (fSol == NULL) {
        throw SBPL_Exception("ERROR: could not open solution file");
    }
    for (unsigned int i = 0; i < solution_stateIDs_V.size(); i++) {
        environment_robarm.PrintState(solution_stateIDs_V[i], true, fSol);
    }
    fclose(fSol);

    //print a path
    if (bRet) {
        //print the solution
        printf("Solution is found\n");
    }
    else
        printf("Solution does not exist\n");

    fflush(NULL);

    delete planner;

    return bRet;
}